

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ParseField
          (ParserImpl *this,FieldDescriptor *field,Message *output)

{
  bool bVar1;
  CppType CVar2;
  Reflection *reflection;
  
  CVar2 = FieldDescriptor::cpp_type(field);
  (*(output->super_MessageLite)._vptr_MessageLite[0x11])(output);
  if (CVar2 == CPPTYPE_MESSAGE) {
    bVar1 = ConsumeFieldMessage(this,output,reflection,field);
  }
  else {
    bVar1 = ConsumeFieldValue(this,output,reflection,field);
  }
  if (bVar1 == false) {
    bVar1 = false;
  }
  else {
    bVar1 = (this->tokenizer_).current_.type == TYPE_END;
  }
  return bVar1;
}

Assistant:

bool ParseField(const FieldDescriptor* field, Message* output) {
    bool suc;
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      suc = ConsumeFieldMessage(output, output->GetReflection(), field);
    } else {
      suc = ConsumeFieldValue(output, output->GetReflection(), field);
    }
    return suc && LookingAtType(io::Tokenizer::TYPE_END);
  }